

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::ComputeShaderBase::ValidateReadBufferCenteredQuad
          (ComputeShaderBase *this,int width,int height,vec3 *expected)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  int y;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  allocator_type local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&fb,(long)(height * width),(allocator_type *)&data);
  iVar12 = height * width * 4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&data,(long)iVar12,&local_61);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,width,height,0x1908
             ,0x1401,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  auVar2 = _DAT_01a35670;
  if (0 < iVar12) {
    lVar4 = 0;
    do {
      iVar5 = (int)lVar4 >> 2;
      bVar3 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4 + 2];
      auVar14._0_8_ =
           (double)(*(ushort *)
                     (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start + lVar4) & 0xff);
      auVar14._8_8_ =
           (double)(byte)(*(ushort *)
                           (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar4) >> 8);
      auVar14 = divpd(auVar14,auVar2);
      *(ulong *)fb.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar5].m_data =
           CONCAT44((float)auVar14._8_8_,(float)auVar14._0_8_);
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start[iVar5].m_data[2] = (float)bVar3 / 255.0;
      lVar4 = lVar4 + 4;
    } while (lVar4 < iVar12);
  }
  fVar13 = (float)height * 0.1 + 1.0;
  iVar12 = (int)fVar13;
  iVar5 = (int)(((float)height - (fVar13 + fVar13)) + -1.0);
  if (iVar12 < iVar5) {
    fVar13 = (float)width * 0.1 + 1.0;
    iVar6 = (int)fVar13;
    iVar8 = (int)(((float)width - (fVar13 + fVar13)) + -1.0);
    fVar13 = (this->g_color_eps).m_data[0];
    iVar9 = iVar12 * width + iVar6;
    do {
      iVar10 = iVar8 - iVar6;
      iVar11 = iVar9;
      if (iVar6 < iVar8) {
        do {
          fVar15 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[0] - expected->m_data[0]
          ;
          fVar16 = -fVar15;
          if (-fVar15 <= fVar15) {
            fVar16 = fVar15;
          }
          if (fVar13 < fVar16) goto LAB_00c1abf3;
          fVar15 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[1] - expected->m_data[1]
          ;
          fVar16 = -fVar15;
          if (-fVar15 <= fVar15) {
            fVar16 = fVar15;
          }
          if ((this->g_color_eps).m_data[1] < fVar16) goto LAB_00c1abf3;
          fVar15 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[2] - expected->m_data[2]
          ;
          fVar16 = -fVar15;
          if (-fVar15 <= fVar15) {
            fVar16 = fVar15;
          }
          if ((this->g_color_eps).m_data[2] < fVar16) goto LAB_00c1abf3;
          iVar11 = iVar11 + 1;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      iVar12 = iVar12 + 1;
      iVar9 = iVar9 + width;
    } while (iVar12 != iVar5);
  }
  else {
    fVar13 = (this->g_color_eps).m_data[0];
  }
  iVar12 = width * 2 + 2;
  fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar12].m_data[0];
  fVar15 = -fVar16;
  if (-fVar16 <= fVar16) {
    fVar15 = fVar16;
  }
  if (fVar13 < fVar15) {
LAB_00c1aacc:
    bVar7 = false;
  }
  else {
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar12].m_data[1];
    fVar15 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar15 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar15 && fVar15 != *pfVar1) goto LAB_00c1aacc;
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar12].m_data[2];
    fVar15 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar15 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar7 = fVar15 < *pfVar1 || fVar15 == *pfVar1;
  }
  iVar12 = width * 3 + -3;
  fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar12].m_data[0];
  fVar15 = -fVar16;
  if (-fVar16 <= fVar16) {
    fVar15 = fVar16;
  }
  if (fVar13 < fVar15) {
LAB_00c1ab30:
    bVar3 = 0;
  }
  else {
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar12].m_data[1];
    fVar15 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar15 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar15 && fVar15 != *pfVar1) goto LAB_00c1ab30;
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar12].m_data[2];
    fVar15 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar15 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar3 = (fVar15 < *pfVar1 || fVar15 == *pfVar1) & bVar7;
  }
  iVar5 = (height + -3) * width;
  iVar12 = width + -3 + iVar5;
  fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar12].m_data[0];
  fVar15 = -fVar16;
  if (-fVar16 <= fVar16) {
    fVar15 = fVar16;
  }
  if (fVar13 < fVar15) {
LAB_00c1ab94:
    bVar3 = 0;
  }
  else {
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar12].m_data[1];
    fVar15 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar15 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar15 && fVar15 != *pfVar1) goto LAB_00c1ab94;
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar12].m_data[2];
    fVar15 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar15 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar3 = (fVar15 < *pfVar1 || fVar15 == *pfVar1) & bVar3;
  }
  iVar5 = iVar5 + 2;
  fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar5].m_data[0];
  fVar15 = -fVar16;
  if (-fVar16 <= fVar16) {
    fVar15 = fVar16;
  }
  if (fVar15 <= fVar13) {
    fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar5].m_data[1];
    fVar16 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar16 = fVar13;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (fVar16 < *pfVar1 || fVar16 == *pfVar1) {
      fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data[2];
      fVar16 = -fVar13;
      if (-fVar13 <= fVar13) {
        fVar16 = fVar13;
      }
      pfVar1 = (this->g_color_eps).m_data + 2;
      bVar7 = (bool)((fVar16 < *pfVar1 || fVar16 == *pfVar1) & bVar3);
      goto LAB_00c1abf5;
    }
  }
LAB_00c1abf3:
  bVar7 = false;
LAB_00c1abf5:
  if ((data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start == (pointer)0x0) ||
     (operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start),
     fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool ValidateReadBufferCenteredQuad(int width, int height, const vec3& expected)
	{
		bool				 result = true;
		std::vector<vec3>	fb(width * height);
		std::vector<GLubyte> data(width * height * 4);
		glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

		for (int i = 0; i < width * height * 4; i += 4)
		{
			fb[i / 4] = vec3(static_cast<GLfloat>(data[i] / 255.), static_cast<GLfloat>(data[i + 1] / 255.),
							 static_cast<GLfloat>(data[i + 2] / 255.));
		}

		int startx = int((static_cast<float>(width) * 0.1f) + 1);
		int starty = int((static_cast<float>(height) * 0.1f) + 1);
		int endx   = int(static_cast<float>(width) - 2 * ((static_cast<float>(width) * 0.1f) + 1) - 1);
		int endy   = int(static_cast<float>(height) - 2 * ((static_cast<float>(height) * 0.1f) + 1) - 1);

		for (int y = starty; y < endy; ++y)
		{
			for (int x = startx; x < endx; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					return false;
				}
			}
		}

		if (!ColorEqual(fb[2 * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[2 * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}

		return result;
	}